

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_delta_decoder.h
# Opt level: O1

bool __thiscall
draco::PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>::
ComputeOriginalValues
          (PredictionSchemeDeltaDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
           *this,CorrType *in_corr,int *out_data,int size,int num_components,PointIndex *param_5)

{
  pointer piVar1;
  pointer piVar2;
  void *__s;
  long lVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  CorrType *pCVar7;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar8;
  size_type __new_size;
  ulong __n;
  
  (this->super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
  ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_ = num_components;
  this_00 = &(this->
             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
             ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_;
  __new_size = (size_type)num_components;
  std::vector<int,_std::allocator<int>_>::resize(this_00,__new_size);
  __n = 0xffffffffffffffff;
  if (-1 < num_components) {
    __n = __new_size * 4;
  }
  __s = operator_new__(__n);
  memset(__s,0,__n);
  if (0 < (this->
          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
          ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_) {
    piVar1 = (this->
             super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
             ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    lVar3 = 0;
    do {
      iVar4 = *(int *)((long)__s + lVar3 * 4);
      iVar6 = (this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
      if ((iVar6 < iVar4) ||
         (iVar6 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_,
         iVar4 < iVar6)) {
        piVar1[lVar3] = iVar6;
      }
      else {
        piVar1[lVar3] = iVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->
                     super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                     ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_);
  }
  piVar1 = (this->
           super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
           ).transform_.super_PredictionSchemeWrapTransformBase<int>.clamped_value_.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  if (0 < (this->
          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
          ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_) {
    lVar3 = 0;
    do {
      iVar4 = in_corr[lVar3] + piVar1[lVar3];
      out_data[lVar3] = iVar4;
      if ((this->
          super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
          ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ < iVar4) {
        iVar6 = -(this->
                 super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                 ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
LAB_0015062e:
        out_data[lVar3] = iVar4 + iVar6;
      }
      else if (iVar4 < (this->
                       super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                       ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_) {
        iVar6 = (this->
                super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
        goto LAB_0015062e;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->
                     super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                     ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_);
  }
  if (num_components < size) {
    piVar5 = out_data + __new_size;
    pCVar7 = in_corr + __new_size;
    sVar8 = __new_size;
    do {
      if (0 < (this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_) {
        piVar2 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          iVar4 = out_data[lVar3];
          iVar6 = (this->
                  super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                  ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_;
          if ((iVar6 < iVar4) ||
             (iVar6 = (this->
                      super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                      ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_,
             iVar4 < iVar6)) {
            piVar2[lVar3] = iVar6;
          }
          else {
            piVar2[lVar3] = iVar4;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (this->
                         super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                         ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_);
      }
      if (0 < (this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_) {
        lVar3 = 0;
        do {
          iVar4 = pCVar7[lVar3] + piVar1[lVar3];
          piVar5[lVar3] = iVar4;
          if ((this->
              super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
              ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_value_ < iVar4) {
            iVar6 = -(this->
                     super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                     ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
LAB_001506c6:
            piVar5[lVar3] = iVar4 + iVar6;
          }
          else if (iVar4 < (this->
                           super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                           ).transform_.super_PredictionSchemeWrapTransformBase<int>.min_value_) {
            iVar6 = (this->
                    super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                    ).transform_.super_PredictionSchemeWrapTransformBase<int>.max_dif_;
            goto LAB_001506c6;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (this->
                         super_PredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>_>
                         ).transform_.super_PredictionSchemeWrapTransformBase<int>.num_components_);
      }
      sVar8 = sVar8 + __new_size;
      out_data = out_data + __new_size;
      piVar5 = piVar5 + __new_size;
      pCVar7 = pCVar7 + __new_size;
    } while ((long)sVar8 < (long)size);
  }
  operator_delete__(__s);
  return true;
}

Assistant:

bool PredictionSchemeDeltaDecoder<DataTypeT, TransformT>::ComputeOriginalValues(
    const CorrType *in_corr, DataTypeT *out_data, int size, int num_components,
    const PointIndex *) {
  this->transform().Init(num_components);
  // Decode the original value for the first element.
  std::unique_ptr<DataTypeT[]> zero_vals(new DataTypeT[num_components]());
  this->transform().ComputeOriginalValue(zero_vals.get(), in_corr, out_data);

  // Decode data from the front using D(i) = D(i) + D(i - 1).
  for (int i = num_components; i < size; i += num_components) {
    this->transform().ComputeOriginalValue(out_data + i - num_components,
                                           in_corr + i, out_data + i);
  }
  return true;
}